

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018bf10 = 0x2d2d2d2d2d2d2d;
    uRam000000000018bf17._0_1_ = '-';
    uRam000000000018bf17._1_1_ = '-';
    uRam000000000018bf17._2_1_ = '-';
    uRam000000000018bf17._3_1_ = '-';
    uRam000000000018bf17._4_1_ = '-';
    uRam000000000018bf17._5_1_ = '-';
    uRam000000000018bf17._6_1_ = '-';
    uRam000000000018bf17._7_1_ = '-';
    DAT_0018bf00 = '-';
    DAT_0018bf00_1._0_1_ = '-';
    DAT_0018bf00_1._1_1_ = '-';
    DAT_0018bf00_1._2_1_ = '-';
    DAT_0018bf00_1._3_1_ = '-';
    DAT_0018bf00_1._4_1_ = '-';
    DAT_0018bf00_1._5_1_ = '-';
    DAT_0018bf00_1._6_1_ = '-';
    uRam000000000018bf08 = 0x2d2d2d2d2d2d2d;
    DAT_0018bf0f = 0x2d;
    DAT_0018bef0 = '-';
    DAT_0018bef0_1._0_1_ = '-';
    DAT_0018bef0_1._1_1_ = '-';
    DAT_0018bef0_1._2_1_ = '-';
    DAT_0018bef0_1._3_1_ = '-';
    DAT_0018bef0_1._4_1_ = '-';
    DAT_0018bef0_1._5_1_ = '-';
    DAT_0018bef0_1._6_1_ = '-';
    uRam000000000018bef8._0_1_ = '-';
    uRam000000000018bef8._1_1_ = '-';
    uRam000000000018bef8._2_1_ = '-';
    uRam000000000018bef8._3_1_ = '-';
    uRam000000000018bef8._4_1_ = '-';
    uRam000000000018bef8._5_1_ = '-';
    uRam000000000018bef8._6_1_ = '-';
    uRam000000000018bef8._7_1_ = '-';
    DAT_0018bee0 = '-';
    DAT_0018bee0_1._0_1_ = '-';
    DAT_0018bee0_1._1_1_ = '-';
    DAT_0018bee0_1._2_1_ = '-';
    DAT_0018bee0_1._3_1_ = '-';
    DAT_0018bee0_1._4_1_ = '-';
    DAT_0018bee0_1._5_1_ = '-';
    DAT_0018bee0_1._6_1_ = '-';
    uRam000000000018bee8._0_1_ = '-';
    uRam000000000018bee8._1_1_ = '-';
    uRam000000000018bee8._2_1_ = '-';
    uRam000000000018bee8._3_1_ = '-';
    uRam000000000018bee8._4_1_ = '-';
    uRam000000000018bee8._5_1_ = '-';
    uRam000000000018bee8._6_1_ = '-';
    uRam000000000018bee8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018bed8._0_1_ = '-';
    uRam000000000018bed8._1_1_ = '-';
    uRam000000000018bed8._2_1_ = '-';
    uRam000000000018bed8._3_1_ = '-';
    uRam000000000018bed8._4_1_ = '-';
    uRam000000000018bed8._5_1_ = '-';
    uRam000000000018bed8._6_1_ = '-';
    uRam000000000018bed8._7_1_ = '-';
    DAT_0018bf1f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}